

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O2

void __thiscall DAGPropagator::~DAGPropagator(DAGPropagator *this)

{
  Tint **ppTVar1;
  int i;
  long lVar2;
  
  (this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator._vptr_Propagator =
       (_func_int **)&PTR__DAGPropagator_001f14c8;
  for (lVar2 = 0; ppTVar1 = this->reachability,
      lVar2 < (int)(this->super_DReachabilityPropagator).super_GraphPropagator.vs.sz;
      lVar2 = lVar2 + 1) {
    if (ppTVar1[lVar2] != (Tint *)0x0) {
      operator_delete__(ppTVar1[lVar2]);
    }
  }
  if (ppTVar1 != (Tint **)0x0) {
    operator_delete__(ppTVar1);
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->processed_n).super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->processed_e).super__Bvector_base<std::allocator<bool>_>);
  std::vector<DAGPropagator::TrailedPredList,_std::allocator<DAGPropagator::TrailedPredList>_>::
  ~vector(&this->preds);
  std::vector<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>::
  ~vector(&this->succs);
  DReachabilityPropagator::~DReachabilityPropagator(&this->super_DReachabilityPropagator);
  return;
}

Assistant:

DAGPropagator::~DAGPropagator() {
	for (int i = 0; i < nbNodes(); i++) {
		delete[] reachability[i];
	}
	delete[] reachability;
}